

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_isfile(char *zPath)

{
  int iVar1;
  undefined1 local_a8 [4];
  int rc;
  stat st;
  char *zPath_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)zPath;
  iVar1 = stat(zPath,(stat *)local_a8);
  if (iVar1 == 0) {
    zPath_local._4_4_ = -1;
    if (((uint)st.st_nlink & 0xf000) == 0x8000) {
      zPath_local._4_4_ = 0;
    }
  }
  else {
    zPath_local._4_4_ = -1;
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixVfs_isfile(const char *zPath)
{
	struct stat st;
	int rc;
	rc = stat(zPath, &st);
	if( rc != 0 ){
	 return -1;
	}
	rc = S_ISREG(st.st_mode);
	return rc ? JX9_OK : -1 ;
}